

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

JavascriptArray *
Js::JavascriptOperators::GetOwnPropertySymbols(Var instance,ScriptContext *scriptContext)

{
  bool bVar1;
  RecyclableObject *object;
  JavascriptProxy *this;
  JavascriptArray *pJVar2;
  
  object = ToObject(instance,scriptContext);
  bVar1 = VarIs<Js::JavascriptProxy>(instance);
  if (bVar1) {
    this = UnsafeVarTo<Js::JavascriptProxy>(instance);
  }
  else {
    this = (JavascriptProxy *)0x0;
  }
  if (this != (JavascriptProxy *)0x0) {
    pJVar2 = JavascriptProxy::PropertyKeysTrap(this,GetOwnPropertySymbolKind,scriptContext);
    return pJVar2;
  }
  pJVar2 = JavascriptObject::CreateOwnSymbolPropertiesHelper(object,scriptContext);
  return pJVar2;
}

Assistant:

JavascriptArray* JavascriptOperators::GetOwnPropertySymbols(Var instance, ScriptContext *scriptContext)
    {
        RecyclableObject *object = ToObject(instance, scriptContext);
        AssertOrFailFast(VarIsCorrectType(object));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Object_Constructor_getOwnPropertySymbols);

        JavascriptProxy* proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instance);
        if (proxy)
        {
            return proxy->PropertyKeysTrap(JavascriptProxy::KeysTrapKind::GetOwnPropertySymbolKind, scriptContext);
        }

        return JavascriptObject::CreateOwnSymbolPropertiesHelper(object, scriptContext);
    }